

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_get_handle(TRANSFER_HANDLE transfer,handle *handle_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  TRANSFER_INSTANCE *transfer_instance;
  uint32_t item_count;
  int result;
  handle *handle_value_local;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1c68;
  }
  else {
    _item_count = handle_value;
    handle_value_local = (handle *)transfer;
    iVar1 = amqpvalue_get_composite_item_count
                      (transfer->composite_value,(uint32_t *)&transfer_instance);
    if (iVar1 == 0) {
      if ((int)transfer_instance == 0) {
        transfer_instance._4_4_ = 0x1c76;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(transfer->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          transfer_instance._4_4_ = 0x1c7e;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            transfer_instance._4_4_ = 0;
          }
          else {
            transfer_instance._4_4_ = 0x1c85;
          }
        }
      }
    }
    else {
      transfer_instance._4_4_ = 0x1c70;
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int transfer_get_handle(TRANSFER_HANDLE transfer, handle* handle_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        if (amqpvalue_get_composite_item_count(transfer_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(transfer_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_handle(item_value, handle_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}